

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::sanitize_append_path_element(aux *this,string *path,string_view element)

{
  long lVar1;
  char *pcVar2;
  aux *paVar3;
  uint uVar4;
  pair<int,_int> pVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar10;
  char *extraout_RDX_02;
  long lVar11;
  int iVar12;
  string *psVar13;
  string_view str;
  ulong local_88;
  uint local_7c;
  aux *local_78;
  ulong local_70;
  char *local_68;
  int local_5c;
  string *local_58;
  char *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pcVar9 = (char *)element._M_len;
  if ((path != (string *)0x1) || (*pcVar9 != '.')) {
    ::std::__cxx11::string::reserve((ulong)this);
    if (*(long *)(this + 8) == 0) {
      local_38 = 0;
      pcVar10 = extraout_RDX;
    }
    else {
      ::std::__cxx11::string::push_back((char)this);
      local_38 = -1;
      pcVar10 = extraout_RDX_00;
    }
    if (path == (string *)0x0) {
      ::std::__cxx11::string::append((char *)this);
      return;
    }
    local_40 = (long)(int)path;
    local_5c = (int)path + -10;
    local_48 = local_40 + -1;
    local_88 = 0;
    psVar13 = (string *)0x0;
    local_70 = 0;
    local_68 = (char *)0x0;
    local_78 = this;
    local_58 = path;
    local_50 = pcVar9;
    do {
      str._M_str = pcVar10;
      str._M_len = (size_t)(pcVar9 + (long)psVar13);
      pVar5 = parse_utf8_codepoint((aux *)((long)path - (long)psVar13),str);
      uVar4 = pVar5.first;
      lVar8 = (long)pVar5 >> 0x20;
      if ((int)uVar4 < 0) {
LAB_003633a4:
        ::std::__cxx11::string::push_back((char)local_78);
        local_88 = (ulong)((int)local_88 + 1);
        pcVar10 = extraout_RDX_02;
      }
      else {
        local_7c = uVar4;
        piVar6 = ::std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (libtorrent::(anonymous_namespace)::filter_path_character(int)::bad_cp,
                            ".%d%s",&local_7c);
        paVar3 = local_78;
        pcVar10 = extraout_RDX_01;
        if ((piVar6 == (int *)".%d%s") &&
           ((0x7f < (int)local_7c ||
            (((pcVar10 = extraout_RDX_01, (char)local_7c != '\0' &&
              (pcVar10 = extraout_RDX_01, (local_7c & 0xff) != 0x5c)) &&
             (pcVar10 = extraout_RDX_01, (local_7c & 0xff) != 0x2f)))))) {
          if (uVar4 < 0x20) goto LAB_003633a4;
          if (psVar13 < (string *)((long)&(psVar13->_M_dataplus)._M_p + lVar8)) {
            lVar11 = 0;
            do {
              ::std::__cxx11::string::push_back((char)paVar3);
              lVar11 = lVar11 + 1;
            } while (lVar8 != lVar11);
          }
          local_68 = (char *)CONCAT71((int7)((ulong)local_68 >> 8),(char)local_68 + (uVar4 == 0x2e))
          ;
          uVar4 = (int)local_88 + pVar5.second;
          local_88 = (ulong)uVar4;
          pcVar10 = local_68;
          pcVar9 = local_50;
          path = local_58;
          if (0xef < (int)uVar4) {
            uVar7 = local_88;
            if ((local_70 & 1) == 0) {
              iVar12 = (int)psVar13;
              if ((int)psVar13 < local_5c) {
                iVar12 = local_5c;
              }
              pcVar10 = (char *)(long)iVar12;
              uVar7 = local_40 - ((ulong)pVar5 >> 0x20);
              lVar11 = local_48;
              do {
                if (lVar11 <= (long)pcVar10) goto LAB_003633f2;
                lVar1 = lVar11 + -1;
                uVar7 = uVar7 - 1;
                pcVar2 = local_50 + lVar11;
                lVar11 = lVar1;
              } while (*pcVar2 != '.');
              if (lVar1 == -2) break;
              psVar13 = (string *)(long)(int)uVar7;
            }
            local_70 = CONCAT71((int7)(uVar7 >> 8),1);
          }
        }
      }
      psVar13 = (string *)((long)&(psVar13->_M_dataplus)._M_p + lVar8);
      uVar4 = (uint)local_88;
    } while (psVar13 < path);
LAB_003633f2:
    local_88._0_4_ = uVar4;
    if ((int)(uint)local_88 < 3 && (uint)local_88 == (int)(char)local_68) {
      lVar8 = (*(long *)(local_78 + 8) + *(long *)local_78) - (long)(int)(uint)local_88;
      *(long *)(local_78 + 8) = (lVar8 + local_38) - *(long *)local_78;
      *(undefined1 *)(lVar8 + local_38) = 0;
    }
    else if (*(long *)(local_78 + 8) == 0) {
      ::std::__cxx11::string::_M_replace((ulong)local_78,0,(char *)0x0,0x3f6eae);
    }
  }
  return;
}

Assistant:

void sanitize_append_path_element(std::string& path, string_view element)
	{
		if (element.size() == 1 && element[0] == '.') return;

#ifdef TORRENT_WINDOWS
#define TORRENT_SEPARATOR '\\'
#else
#define TORRENT_SEPARATOR '/'
#endif
		path.reserve(path.size() + element.size() + 2);
		int added_separator = 0;
		if (!path.empty())
		{
			path += TORRENT_SEPARATOR;
			added_separator = 1;
		}

		if (element.empty())
		{
			path += "_";
			return;
		}

#if !TORRENT_USE_UNC_PATHS && defined TORRENT_WINDOWS
#pragma message ("building for windows without UNC paths is deprecated")

		// if we're not using UNC paths on windows, there
		// are certain filenames we're not allowed to use
		static const char const* reserved_names[] =
		{
			"con", "prn", "aux", "clock$", "nul",
			"com0", "com1", "com2", "com3", "com4",
			"com5", "com6", "com7", "com8", "com9",
			"lpt0", "lpt1", "lpt2", "lpt3", "lpt4",
			"lpt5", "lpt6", "lpt7", "lpt8", "lpt9"
		};
		int num_names = sizeof(reserved_names)/sizeof(reserved_names[0]);

		// this is not very efficient, but it only affects some specific
		// windows builds for now anyway (not even the default windows build)
		std::string pe(element);
		char const* file_end = strrchr(pe.c_str(), '.');
		std::string name = file_end
			? std::string(pe.data(), file_end)
			: pe;
		std::transform(name.begin(), name.end(), name.begin(), &to_lower);
		char const** str = std::find(reserved_names, reserved_names + num_names, name);
		if (str != reserved_names + num_names)
		{
			pe = "_" + pe;
			element = string_view();
		}
#endif
#ifdef TORRENT_WINDOWS
		// this counts the number of unicode characters
		// we've added (which is different from the number
		// of bytes)
		int unicode_chars = 0;
#endif

		int added = 0;
		// the number of dots we've added
		char num_dots = 0;
		bool found_extension = false;

		int seq_len = 0;
		for (std::size_t i = 0; i < element.size(); i += std::size_t(seq_len))
		{
			std::int32_t code_point;
			std::tie(code_point, seq_len) = parse_utf8_codepoint(element.substr(i));

			if (code_point >= 0 && filter_path_character(code_point))
			{
				continue;
			}

			if (code_point < 0 || !valid_path_character(code_point))
			{
				// invalid utf8 sequence, replace with "_"
				path += '_';
				++added;
#ifdef TORRENT_WINDOWS
				++unicode_chars;
#endif
				continue;
			}

			// validation passed, add it to the output string
			for (std::size_t k = i; k < i + std::size_t(seq_len); ++k)
			{
				TORRENT_ASSERT(element[k] != 0);
				path.push_back(element[k]);
			}

			if (code_point == '.') ++num_dots;

			added += seq_len;
#ifdef TORRENT_WINDOWS
			++unicode_chars;
#endif

			// any given path element should not
			// be more than 255 characters
			// if we exceed 240, pick up any potential
			// file extension and add that too
#ifdef TORRENT_WINDOWS
			if (unicode_chars >= 240 && !found_extension)
#else
			if (added >= 240 && !found_extension)
#endif
			{
				int dot = -1;
				for (int j = int(element.size()) - 1;
					j > std::max(int(element.size()) - 10, int(i)); --j)
				{
					if (element[aux::numeric_cast<std::size_t>(j)] != '.') continue;
					dot = j;
					break;
				}
				// there is no extension
				if (dot == -1) break;
				found_extension = true;
				TORRENT_ASSERT(dot > 0);
				i = std::size_t(dot - seq_len);
			}
		}

		if (added == num_dots && added <= 2)
		{
			// revert everything
			path.erase(path.end() - added - added_separator, path.end());
			return;
		}

#ifdef TORRENT_WINDOWS
		// remove trailing spaces and dots. These aren't allowed in filenames on windows
		for (int i = int(path.size()) - 1; i >= 0; --i)
		{
			if (path[i] != ' ' && path[i] != '.') break;
			path.resize(i);
			--added;
			TORRENT_ASSERT(added >= 0);
		}

		if (added == 0 && added_separator)
		{
			// remove the separator added at the beginning
			path.erase(path.end() - 1);
			return;
		}
#endif

		if (path.empty()) path = "_";
	}